

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void plot_ringer(tgestate_t *state,uint8_t *src)

{
  plot_bitmap(state,src,(state->speccy->screen).pixels + 0x118e,'\x01','\f');
  return;
}

Assistant:

void plot_ringer(tgestate_t *state, const uint8_t *src)
{
  assert(state != NULL);
  assert(src   != NULL);

  plot_bitmap(state,
              src,
              &state->speccy->screen.pixels[screenoffset_BELL_RINGER],
              1, 12 /* dimensions: 8 x 12 */);
}